

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debugallocation_test.cc
# Opt level: O0

void __thiscall
DebugAllocationTest_StompAfter_Test::TestBody(DebugAllocationTest_StompAfter_Test *this)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  int *val;
  char *message;
  char *regex;
  AssertHelper local_98;
  Message local_90;
  int local_84;
  exception *gtest_exception;
  ReturnSentinel gtest_sentinel;
  unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>
  gtest_dt_ptr;
  Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_38;
  pointer local_20;
  DeathTest *gtest_dt;
  int *pint;
  DebugAllocationTest_StompAfter_Test *this_local;
  
  pint = (int *)this;
  val = (int *)operator_new(4);
  gtest_dt = (DeathTest *)noopt<int*>(val);
  *(int *)((long)&gtest_dt->_vptr_DeathTest + 4) = 5;
  bVar1 = testing::internal::AlwaysTrue();
  if (!bVar1) goto LAB_001117ce;
  testing::internal::MakeDeathTestMatcher_abi_cxx11_
            (&local_38,(internal *)"a word after object",regex);
  bVar1 = testing::internal::DeathTest::Create
                    ("delete pint",&local_38,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/debugallocation_test.cc"
                     ,0x83,&local_20);
  testing::
  Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>::
  ~Matcher(&local_38);
  if (((bVar1 ^ 0xffU) & 1) != 0) goto LAB_001117ce;
  if (local_20 == (pointer)0x0) {
    return;
  }
  std::unique_ptr<testing::internal::DeathTest,std::default_delete<testing::internal::DeathTest>>::
  unique_ptr<std::default_delete<testing::internal::DeathTest>,void>
            ((unique_ptr<testing::internal::DeathTest,std::default_delete<testing::internal::DeathTest>>
              *)&gtest_sentinel,local_20);
  iVar2 = (*local_20->_vptr_DeathTest[2])();
  if (iVar2 == 0) {
    iVar2 = (*local_20->_vptr_DeathTest[3])();
    bVar1 = testing::internal::ExitedUnsuccessfully(iVar2);
    uVar3 = (*local_20->_vptr_DeathTest[4])(local_20,(ulong)bVar1);
    if ((uVar3 & 1) != 0) goto LAB_0011179c;
    local_84 = 2;
  }
  else {
    if (iVar2 == 1) {
      testing::internal::DeathTest::ReturnSentinel::ReturnSentinel
                ((ReturnSentinel *)&gtest_exception,local_20);
      bVar1 = testing::internal::AlwaysTrue();
      if ((bVar1) && (gtest_dt != (DeathTest *)0x0)) {
        operator_delete(gtest_dt,4);
      }
      (*local_20->_vptr_DeathTest[5])(local_20,2);
      testing::internal::DeathTest::ReturnSentinel::~ReturnSentinel
                ((ReturnSentinel *)&gtest_exception);
    }
LAB_0011179c:
    local_84 = 0;
  }
  std::unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>
  ::~unique_ptr((unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>
                 *)&gtest_sentinel);
  if (local_84 == 0) {
    return;
  }
LAB_001117ce:
  testing::Message::Message(&local_90);
  message = testing::internal::DeathTest::LastMessage();
  testing::internal::AssertHelper::AssertHelper
            (&local_98,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/debugallocation_test.cc"
             ,0x83,message);
  testing::internal::AssertHelper::operator=(&local_98,&local_90);
  testing::internal::AssertHelper::~AssertHelper(&local_98);
  testing::Message::~Message(&local_90);
  return;
}

Assistant:

TEST(DebugAllocationTest, StompAfter) {
  int* pint = noopt(new int);
  (void)pint;
  pint[1] = 5;
  EXPECT_DEATH(delete pint, "a word after object");
}